

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkRef.hpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)14>_> * __thiscall
vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::operator=
          (Move<vk::Handle<(vk::HandleType)14>_> *this,Move<vk::Handle<(vk::HandleType)14>_> *other)

{
  deUint64 dVar1;
  DeviceInterface *pDVar2;
  VkDevice pVVar3;
  VkAllocationCallbacks *pVVar4;
  
  if (this != other) {
    dVar1 = (other->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
    pDVar2 = (other->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_deviceIface;
    pVVar3 = (other->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_device;
    pVVar4 = (other->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_allocator;
    (other->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal = 0;
    (other->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    (other->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_device = (VkDevice)0x0;
    (other->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    RefBase<vk::Handle<(vk::HandleType)14>_>::reset
              (&this->super_RefBase<vk::Handle<(vk::HandleType)14>_>);
    (this->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_device = pVVar3;
    (this->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_allocator = pVVar4;
    (this->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal = dVar1;
    (this->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_deviceIface = pDVar2;
  }
  return this;
}

Assistant:

inline Move<T>& Move<T>::operator= (Move<T>& other)
{
	if (this != &other)
		this->assign(other.RefBase<T>::disown());

	return *this;
}